

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

void __thiscall Function::~Function(Function *this)

{
  list<Atom_*,_std::allocator<Atom_*>_> *this_00;
  _List_node_base *p_Var1;
  
  this_00 = &this->body;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<Atom_*,_std::allocator<Atom_*>_> *)&p_Var1->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var1 != (_List_node_base *)this_00) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_next + 8))();
    }
    p_Var1[1]._M_next = (_List_node_base *)0x0;
  }
  std::__cxx11::_List_base<Atom_*,_std::allocator<Atom_*>_>::_M_clear
            (&this_00->super__List_base<Atom_*,_std::allocator<Atom_*>_>);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this);
  return;
}

Assistant:

Function::~Function() {
    for (auto &i: body) {
        delete i;
        i = NULL;
    }
}